

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDisclaimer(cmLocalUnixMakefileGenerator3 *this,ostream *os)

{
  ostream *poVar1;
  string local_30 [32];
  
  poVar1 = std::operator<<(os,"# CMAKE generated file: DO NOT EDIT!\n");
  poVar1 = std::operator<<(poVar1,"# Generated by \"");
  (*((this->super_cmLocalGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[2])(local_30);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," Generator, CMake Version ");
  cmVersion::GetMajorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,".");
  cmVersion::GetMinorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDisclaimer(std::ostream& os)
{
  os
    << "# CMAKE generated file: DO NOT EDIT!\n"
    << "# Generated by \"" << this->GlobalGenerator->GetName() << "\""
    << " Generator, CMake Version "
    << cmVersion::GetMajorVersion() << "."
    << cmVersion::GetMinorVersion() << "\n\n";
}